

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_tpl_varnames_h.cc
# Opt level: O2

bool WriteToDisk(bool log_info,string *output_file,string *text)

{
  pointer pcVar1;
  FILE *__s;
  size_t sVar2;
  int *piVar3;
  char *pcVar4;
  int should_log_info;
  undefined7 in_register_00000039;
  
  __s = fopen((output_file->_M_dataplus)._M_p,"wb");
  pcVar1 = (output_file->_M_dataplus)._M_p;
  should_log_info = (int)CONCAT71(in_register_00000039,log_info);
  if (__s == (FILE *)0x0) {
    LogPrintf(2,should_log_info,"Can\'t open %s",pcVar1);
  }
  else {
    LogPrintf(0,should_log_info,"Creating %s",pcVar1);
    sVar2 = fwrite((text->_M_dataplus)._M_p,1,text->_M_string_length,__s);
    if (sVar2 != text->_M_string_length) {
      pcVar1 = (output_file->_M_dataplus)._M_p;
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      LogPrintf(2,should_log_info,"Can\'t write %s: %s",pcVar1,pcVar4);
    }
    fclose(__s);
  }
  return __s != (FILE *)0x0;
}

Assistant:

static bool WriteToDisk(bool log_info, const string& output_file,
                        const string& text) {
  FILE* outfile = fopen(output_file.c_str(), "wb");
  if (!outfile) {
    LogPrintf(LOG_ERROR, log_info, "Can't open %s", output_file.c_str());
    return false;
  }
  LogPrintf(LOG_INFO, log_info, "Creating %s", output_file.c_str());
  if (fwrite(text.c_str(), 1, text.length(), outfile) != text.length()) {
    LogPrintf(LOG_ERROR, log_info, "Can't write %s: %s",
              output_file.c_str(), strerror(errno));
  }
  fclose(outfile);
  return true;
}